

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

LY_ERR ylib_feature(lyd_node *parent,lysp_module *pmod)

{
  LY_ERR LVar1;
  lysp_feature *plVar2;
  lysp_include *plVar3;
  ulong uVar4;
  lysp_feature *plVar5;
  lysp_feature *plVar6;
  ulong uVar7;
  
  if (pmod->mod->implemented != '\0') {
    plVar5 = pmod->features;
    plVar2 = plVar5;
    for (plVar6 = plVar5;
        (plVar2 != (lysp_feature *)0x0 &&
        ((ulong)((long)plVar6 - (long)plVar2) >> 6 < *(ulong *)&plVar2[-1].flags));
        plVar6 = plVar6 + 1) {
      if ((plVar5->flags & 0x20) != 0) {
        LVar1 = lyd_new_term(parent,(lys_module *)0x0,"feature",plVar5->name,0,(lyd_node **)0x0);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        plVar2 = pmod->features;
      }
      plVar5 = plVar5 + 1;
    }
    plVar3 = pmod->includes;
    uVar7 = 0;
    while( true ) {
      if (plVar3 == (lysp_include *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(ulong *)(plVar3[-1].rev + 8);
      }
      if (uVar4 <= uVar7) break;
      plVar5 = (plVar3[uVar7].submodule)->features;
      if ((plVar5 != (lysp_feature *)0x0) && (plVar2 = plVar5, *(long *)&plVar5[-1].flags != 0)) {
        do {
          plVar2 = plVar2 + 1;
          if ((plVar5->flags & 0x20) != 0) {
            LVar1 = lyd_new_term(parent,(lys_module *)0x0,"feature",plVar5->name,0,(lyd_node **)0x0)
            ;
            if (LVar1 != LY_SUCCESS) {
              return LVar1;
            }
            plVar3 = pmod->includes;
          }
          plVar6 = (plVar3[uVar7].submodule)->features;
        } while ((plVar6 != (lysp_feature *)0x0) &&
                (plVar5 = plVar5 + 1,
                (ulong)((long)plVar2 - (long)plVar6) >> 6 < *(ulong *)&plVar6[-1].flags));
      }
      uVar7 = uVar7 + 1;
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
ylib_feature(struct lyd_node *parent, const struct lysp_module *pmod)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lysp_feature *f;

    if (!pmod->mod->implemented) {
        /* no features can be enabled */
        return LY_SUCCESS;
    }

    LY_ARRAY_FOR(pmod->features, struct lysp_feature, f) {
        if (!(f->flags & LYS_FENABLED)) {
            continue;
        }

        LY_CHECK_RET(lyd_new_term(parent, NULL, "feature", f->name, 0, NULL));
    }

    LY_ARRAY_FOR(pmod->includes, u) {
        LY_ARRAY_FOR(pmod->includes[u].submodule->features, struct lysp_feature, f) {
            if (!(f->flags & LYS_FENABLED)) {
                continue;
            }

            LY_CHECK_RET(lyd_new_term(parent, NULL, "feature", f->name, 0, NULL));
        }
    }

    return LY_SUCCESS;
}